

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment_uri.h
# Opt level: O0

bool ktx::operator==(SelectorRange *param_1)

{
  bool bVar1;
  SelectorRange *in_stack_ffffffffffffffa8;
  
  SelectorRange::SelectorRange();
  bVar1 = operator==(param_1,in_stack_ffffffffffffffa8);
  SelectorRange::~SelectorRange((SelectorRange *)0x2764e1);
  return bVar1;
}

Assistant:

bool operator==(const SelectorRange& var, All_t) {
        return var == SelectorRange{all};
    }